

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::defaultCollisionHandler(btSoftBody *this,btSoftBody *psb)

{
  uint uVar1;
  uint uVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  CollideCL_SS docollide;
  undefined1 local_50 [12];
  btScalar bStack_44;
  undefined8 uStack_40;
  btScalar bStack_38;
  
  uVar1 = (psb->m_cfg).collisions;
  uVar2 = (this->m_cfg).collisions & uVar1 & 0x30;
  if (uVar2 == 0x10) {
    if (this != psb) {
      local_50._0_8_ = &PTR__ICollide_00229790;
      (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
      (*((psb->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
      bStack_38 = extraout_XMM0_Da_00 + extraout_XMM0_Da;
      unique0x100001ec = this;
      uStack_40 = psb;
      btDbvt::collideTT(&this->m_ndbvt,(this->m_ndbvt).m_root,(psb->m_fdbvt).m_root,
                        (ICollide *)local_50);
      uStack_40 = this;
      unique0x10000204 = psb;
      btDbvt::collideTT(&psb->m_ndbvt,(psb->m_ndbvt).m_root,(this->m_fdbvt).m_root,
                        (ICollide *)local_50);
    }
  }
  else if ((uVar2 == 0x20) && (this != psb || (uVar1 & 0x40) != 0)) {
    local_50._8_4_ = 1.0;
    bStack_44 = 0.0;
    uStack_40._0_4_ = 0.0;
    uStack_40._4_4_ = 0.0;
    bStack_38 = 0.0;
    local_50._0_8_ = &PTR__ICollide_00229730;
    btSoftColliders::CollideCL_SS::ProcessSoftSoft((CollideCL_SS *)local_50,this,psb);
  }
  return;
}

Assistant:

void			btSoftBody::defaultCollisionHandler(btSoftBody* psb)
{
	const int cf=m_cfg.collisions&psb->m_cfg.collisions;
	switch(cf&fCollision::SVSmask)
	{
	case	fCollision::CL_SS:
		{
			
			//support self-collision if CL_SELF flag set
			if (this!=psb || psb->m_cfg.collisions&fCollision::CL_SELF)
			{
				btSoftColliders::CollideCL_SS	docollide;
				docollide.ProcessSoftSoft(this,psb);
			}
			
		}
		break;
	case	fCollision::VF_SS:
		{
			//only self-collision for Cluster, not Vertex-Face yet
			if (this!=psb)
			{
				btSoftColliders::CollideVF_SS	docollide;
				/* common					*/ 
				docollide.mrg=	getCollisionShape()->getMargin()+
					psb->getCollisionShape()->getMargin();
				/* psb0 nodes vs psb1 faces	*/ 
				docollide.psb[0]=this;
				docollide.psb[1]=psb;
				docollide.psb[0]->m_ndbvt.collideTT(	docollide.psb[0]->m_ndbvt.m_root,
					docollide.psb[1]->m_fdbvt.m_root,
					docollide);
				/* psb1 nodes vs psb0 faces	*/ 
				docollide.psb[0]=psb;
				docollide.psb[1]=this;
				docollide.psb[0]->m_ndbvt.collideTT(	docollide.psb[0]->m_ndbvt.m_root,
					docollide.psb[1]->m_fdbvt.m_root,
					docollide);
			}
		}
		break;
	default:
		{
			
		}
	}
}